

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O2

int gdTransformAffineCopy
              (gdImagePtr dst,int dst_x,int dst_y,gdImagePtr src,gdRectPtr src_region,double *affine
              )

{
  gdInterpolationMethod gVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int color;
  long lVar5;
  int iVar6;
  long lVar7;
  gdInterpolationMethod id;
  int iVar8;
  undefined4 in_register_00000014;
  int iVar9;
  undefined4 in_register_00000034;
  int iVar10;
  double dVar11;
  int backup_clipy2;
  int backup_clipx2;
  int backup_clipy1;
  int backup_clipx1;
  long local_e0;
  double local_d8;
  ulong local_d0;
  double local_c8;
  double local_c0;
  undefined4 local_b4;
  gdPointF src_pt;
  gdPointF pt;
  int local_90;
  gdRect bbox;
  int c2y;
  int c2x;
  int c1y;
  int c1x;
  double inv [6];
  
  local_d8 = (double)CONCAT44(in_register_00000034,dst_x);
  local_e0 = CONCAT44(in_register_00000014,dst_y);
  gVar1 = src->interpolation_id;
  id = GD_DEFAULT;
  if ((gVar1 < GD_POWER) &&
     (id = GD_DEFAULT, (0x10028U >> (gVar1 & (GD_NEAREST_NEIGHBOUR|GD_MITCHELL)) & 1) != 0)) {
    src->interpolation = filter_bicubic;
    src->interpolation_id = GD_BICUBIC;
    id = gVar1;
  }
  gdImageGetClip(src,(int *)inv,(int *)&pt,(int *)&src_pt,&bbox.x);
  iVar4 = src_region->x;
  iVar6 = src_region->y;
  iVar10 = iVar4 + src_region->width + -1;
  iVar9 = iVar6 + src_region->height + -1;
  iVar8 = inv[0]._0_4_;
  if (inv[0]._0_4_ < iVar4) {
    iVar8 = iVar4;
  }
  if (src_pt.x._0_4_ < iVar4) {
    iVar8 = src_pt.x._0_4_;
  }
  src_region->x = iVar8;
  iVar4 = pt.x._0_4_;
  if (pt.x._0_4_ < iVar6) {
    iVar4 = iVar6;
  }
  if (bbox.x < iVar6) {
    iVar4 = bbox.x;
  }
  src_region->y = iVar4;
  if (inv[0]._0_4_ < iVar10) {
    inv[0]._0_4_ = iVar10;
  }
  if (src_pt.x._0_4_ < iVar10) {
    inv[0]._0_4_ = src_pt.x._0_4_;
  }
  iVar10 = (inv[0]._0_4_ - iVar8) + 1;
  iVar6 = pt.x._0_4_;
  if (pt.x._0_4_ < iVar9) {
    iVar6 = iVar9;
  }
  src_region->width = iVar10;
  if (bbox.x < iVar9) {
    iVar6 = bbox.x;
  }
  iVar6 = (iVar6 - iVar4) + 1;
  src_region->height = iVar6;
  if ((((0 < iVar8) || (0 < iVar4)) || (iVar10 < src->sx)) ||
     (local_b4 = (undefined4)CONCAT71((int7)((ulong)&src_pt >> 8),1), iVar6 < src->sy)) {
    gdImageGetClip(src,&backup_clipx1,&backup_clipy1,&backup_clipx2,&backup_clipy2);
    gdImageSetClip(src,src_region->x,src_region->y,src_region->x + src_region->width + -1,
                   src_region->y + -1 + src_region->height);
    local_b4 = 0;
  }
  iVar4 = gdTransformAffineBoundingBox(src_region,affine,&bbox);
  if (iVar4 == 0) {
    if ((char)local_b4 == '\0') {
      gdImageSetClip(src,backup_clipx1,backup_clipy1,backup_clipx2,backup_clipy2);
    }
    gdImageSetInterpolationMethod(src,id);
    iVar4 = 0;
  }
  else {
    gdImageGetClip(dst,&c1x,&c1y,&c2x,&c2y);
    iVar4 = -bbox.x;
    if (0 < bbox.x) {
      iVar4 = bbox.x;
    }
    iVar6 = -bbox.y;
    if (0 < bbox.y) {
      iVar6 = bbox.y;
    }
    gdAffineInvert(inv,affine);
    if (dst->alphaBlendingFlag == 0) {
      local_c8 = (double)bbox.y;
      local_c0 = (double)src_region->x;
      iVar8 = local_d8._0_4_;
      lVar7 = (long)local_d8._0_4_;
      local_d8 = (double)src_region->y;
      local_d0 = (ulong)(int)local_e0;
      local_e0 = lVar7 << 2;
      for (lVar7 = 0; lVar3 = local_e0, lVar7 <= (long)iVar6 + (long)bbox.height; lVar7 = lVar7 + 1)
      {
        pt.y = (double)(int)lVar7 + 0.5 + local_c8;
        lVar5 = lVar7 + local_d0;
        if ((-1 < lVar5) && (lVar5 < dst->sy)) {
          piVar2 = dst->tpixels[lVar5];
          for (lVar5 = 0; iVar9 = (int)lVar5, iVar9 <= iVar4 + bbox.width; lVar5 = lVar5 + 1) {
            pt.x = (double)iVar9 + 0.5 + (double)bbox.x;
            gdAffineApplyToPointF(&src_pt,&pt,inv);
            if ((iVar8 + iVar9 < 0) || (dst->sx <= iVar8 + iVar9)) break;
            iVar9 = getPixelInterpolated
                              (src,(double)CONCAT44(src_pt.x._4_4_,src_pt.x._0_4_) + local_c0,
                               src_pt.y + local_d8,-1);
            *(int *)((long)piVar2 + lVar5 * 4 + lVar3) = iVar9;
          }
        }
      }
    }
    else {
      local_c0 = (double)src_region->x;
      local_c8 = (double)src_region->y;
      while (local_90 = (int)((long)iVar6 + (long)bbox.height), bbox.y <= local_90) {
        pt.y = (double)bbox.y + 0.5;
        iVar8 = (int)local_e0;
        dVar11 = 0.0;
        local_d0 = (ulong)(uint)bbox.y;
        for (iVar9 = 0; iVar9 <= iVar4 + bbox.width; iVar9 = iVar9 + 1) {
          pt.x = dVar11 + 0.5;
          gdAffineApplyToPointF(&src_pt,&pt,inv);
          iVar10 = SUB84(local_d8,0);
          color = getPixelInterpolated
                            (src,(double)CONCAT44(src_pt.x._4_4_,src_pt.x._0_4_) + local_c0,
                             src_pt.y + local_c8,0);
          gdImageSetPixel(dst,iVar10 + iVar9,bbox.y + iVar8,color);
          dVar11 = dVar11 + 1.0;
        }
        bbox.y = (int)local_d0 + 1;
      }
    }
    if ((char)local_b4 == '\0') {
      gdImageSetClip(src,backup_clipx1,backup_clipy1,backup_clipx2,backup_clipy2);
    }
    gdImageSetInterpolationMethod(src,id);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

BGD_DECLARE(int) gdTransformAffineCopy(gdImagePtr dst,
		  int dst_x, int dst_y,
		  const gdImagePtr src,
		  gdRectPtr src_region,
		  const double affine[6])
{
	int c1x,c1y,c2x,c2y;
	int backclip = 0;
	int backup_clipx1, backup_clipy1, backup_clipx2, backup_clipy2;
	register int x, y, src_offset_x, src_offset_y;
	double inv[6];
	int *dst_p;
	gdPointF pt, src_pt;
	gdRect bbox;
	int end_x, end_y;
	gdInterpolationMethod interpolation_id_bak = GD_DEFAULT;

	/* These methods use special implementations */
	if (src->interpolation_id == GD_BILINEAR_FIXED || src->interpolation_id == GD_BICUBIC_FIXED || src->interpolation_id == GD_NEAREST_NEIGHBOUR) {
		interpolation_id_bak = src->interpolation_id;
		
		gdImageSetInterpolationMethod(src, GD_BICUBIC);
	}


	gdImageClipRectangle(src, src_region);

	if (src_region->x > 0 || src_region->y > 0
		|| src_region->width < gdImageSX(src)
		|| src_region->height < gdImageSY(src)) {
		backclip = 1;

		gdImageGetClip(src, &backup_clipx1, &backup_clipy1,
		&backup_clipx2, &backup_clipy2);

		gdImageSetClip(src, src_region->x, src_region->y,
			src_region->x + src_region->width - 1,
			src_region->y + src_region->height - 1);
	}

	if (!gdTransformAffineBoundingBox(src_region, affine, &bbox)) {
		if (backclip) {
			gdImageSetClip(src, backup_clipx1, backup_clipy1,
					backup_clipx2, backup_clipy2);
		}
		gdImageSetInterpolationMethod(src, interpolation_id_bak);
		return GD_FALSE;
	}

	gdImageGetClip(dst, &c1x, &c1y, &c2x, &c2y);

	end_x = bbox.width  + abs(bbox.x);
	end_y = bbox.height + abs(bbox.y);

	/* Get inverse affine to let us work with destination -> source */
	gdAffineInvert(inv, affine);

	src_offset_x =  src_region->x;
	src_offset_y =  src_region->y;

	if (dst->alphaBlendingFlag) {
		for (y = bbox.y; y <= end_y; y++) {
			pt.y = y + 0.5;
			for (x = 0; x <= end_x; x++) {
				pt.x = x + 0.5;
				gdAffineApplyToPointF(&src_pt, &pt, inv);
				gdImageSetPixel(dst, dst_x + x, dst_y + y, getPixelInterpolated(src, src_offset_x + src_pt.x, src_offset_y + src_pt.y, 0));
			}
		}
	} else {
		for (y = 0; y <= end_y; y++) {
			pt.y = y + 0.5 + bbox.y;
			if ((dst_y + y) < 0 || ((dst_y + y) > gdImageSY(dst) -1)) {
				continue;
			}
			dst_p = dst->tpixels[dst_y + y] + dst_x;

			for (x = 0; x <= end_x; x++) {
				pt.x = x + 0.5 + bbox.x;
				gdAffineApplyToPointF(&src_pt, &pt, inv);

				if ((dst_x + x) < 0 || (dst_x + x) > (gdImageSX(dst) - 1)) {
					break;
				}
				*(dst_p++) = getPixelInterpolated(src, src_offset_x + src_pt.x, src_offset_y + src_pt.y, -1);
			}
		}
	}

	/* Restore clip if required */
	if (backclip) {
		gdImageSetClip(src, backup_clipx1, backup_clipy1,
				backup_clipx2, backup_clipy2);
	}

	gdImageSetInterpolationMethod(src, interpolation_id_bak);
	return GD_TRUE;
}